

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::ReporterConfig::ReporterConfig(ReporterConfig *this,IConfigPtr *_fullConfig,ostream *_stream)

{
  shared_ptr<const_Catch::IConfig> *in_RDX;
  shared_ptr<const_Catch::IConfig> *in_RSI;
  undefined8 *in_RDI;
  
  *in_RDI = in_RDX;
  clara::std::shared_ptr<const_Catch::IConfig>::shared_ptr(in_RSI,in_RDX);
  return;
}

Assistant:

ReporterConfig::ReporterConfig( IConfigPtr const& _fullConfig, std::ostream& _stream )
    :   m_stream( &_stream ), m_fullConfig( _fullConfig ) {}